

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void __thiscall PSBTOutput::Serialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__last;
  uint uVar1;
  pointer ptVar2;
  KeyOriginInfo hd_keypath;
  _Base_ptr p_Var3;
  uchar *puVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  type *script;
  pointer obj;
  long in_FS_OFFSET;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  pointer puVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  uchar local_59;
  undefined4 local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar6 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar6 = uVar1;
  }
  if (uVar6 != 0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
              (s,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar6 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar6 = uVar1;
  }
  if (uVar6 != 0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
              (s,&(this->witness_script).super_CScriptBase);
  }
  SerializeHDKeypaths<DataStream>(s,&this->hd_keypaths,(CompactSizeWriter)0x2);
  for (p_Var3 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var3 + 2));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var3[2]._M_right);
  }
  __last = &this->m_tap_tree;
  puVar4 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (&this->m_tap_internal_key,__last);
  if ((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       *)puVar4 != __last) {
    SerializeToVector<DataStream,unsigned_char>
              (s,
               "\x05\x06\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
              );
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
               (uchar *)&this->m_tap_internal_key,(uchar *)__last,
               (allocator_type *)&stack0xffffffffffffff78);
    DataStream::operator<<(s,&local_78);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SerializeToVector<DataStream,unsigned_char>
              (s,
               "\x06\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
              );
    pvVar7 = &local_78;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    obj = (this->m_tap_tree).
          super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    ptVar2 = (this->m_tap_tree).
             super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (obj != ptVar2) {
      do {
        local_59 = (obj->
                   super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ).
                   super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   .field_0x19;
        VectorWriter::write((VectorWriter *)&stack0xffffffffffffff78,(int)&local_59,(void *)0x1,
                            (size_t)pvVar7);
        local_59 = (obj->
                   super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ).
                   super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   .super__Head_base<1UL,_unsigned_char,_false>._M_head_impl;
        VectorWriter::write((VectorWriter *)&stack0xffffffffffffff78,(int)&local_59,(void *)0x1,
                            (size_t)pvVar7);
        VectorWriter::operator<<
                  ((VectorWriter *)&stack0xffffffffffffff78,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)obj);
        obj = obj + 1;
      } while (obj != ptVar2);
    }
    DataStream::operator<<(s,&local_78);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  p_Var5 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != p_Var3) {
    do {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x21);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_78,
                 (undefined1 *)
                 ((long)&local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1));
      SerializeMany<DataStream,unsigned_char,XOnlyPubKey>
                (s,
                 "\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
                 ,(XOnlyPubKey *)(p_Var5 + 1));
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar8 = (pointer)0x0;
      pvVar7 = &local_78;
      Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
                ((VectorWriter *)&stack0xffffffffffffff78,
                 (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)(p_Var5 + 2));
      local_58 = *(undefined4 *)&p_Var5[3]._M_left;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_50,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var5[3]._M_right);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = &p_Var3->_M_color;
      hd_keypath._0_8_ = this;
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pvVar7;
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar8;
      SerializeKeyOrigin<VectorWriter>((VectorWriter *)&stack0xffffffffffffff78,hd_keypath);
      if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      DataStream::operator<<(s,&local_78);
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while (p_Var5 != p_Var3);
  }
  for (p_Var3 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var3 + 1));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var3[1]._M_right);
  }
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the redeem script
        if (!redeem_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_REDEEMSCRIPT));
            s << redeem_script;
        }

        // Write the witness script
        if (!witness_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_WITNESSSCRIPT));
            s << witness_script;
        }

        // Write any hd keypaths
        SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_OUT_BIP32_DERIVATION));

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write taproot internal key
        if (!m_tap_internal_key.IsNull()) {
            SerializeToVector(s, PSBT_OUT_TAP_INTERNAL_KEY);
            s << ToByteVector(m_tap_internal_key);
        }

        // Write taproot tree
        if (!m_tap_tree.empty()) {
            SerializeToVector(s, PSBT_OUT_TAP_TREE);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
                s_value << depth;
                s_value << leaf_ver;
                s_value << script;
            }
            s << value;
        }

        // Write taproot bip32 keypaths
        for (const auto& [xonly, leaf] : m_tap_bip32_paths) {
            const auto& [leaf_hashes, origin] = leaf;
            SerializeToVector(s, PSBT_OUT_TAP_BIP32_DERIVATION, xonly);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            s_value << leaf_hashes;
            SerializeKeyOrigin(s_value, origin);
            s << value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }